

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CCEXP.hpp
# Opt level: O0

float * CCEXP::getRow<float>(CCEXP *obj,char *matname,size_t row,size_t *cols)

{
  size_t sel_00;
  unsigned_long uVar1;
  char *pcVar2;
  char *local_58;
  char *local_50;
  float *vret;
  size_t sel;
  size_t *cols_local;
  size_t row_local;
  char *matname_local;
  CCEXP *obj_local;
  
  obj->ErrorId = 0;
  sel_00 = CCEXP::getTableIndexByName(obj,matname);
  uVar1 = std::numeric_limits<unsigned_long>::max();
  if (sel_00 == uVar1) {
    pcVar2 = strrchr("/workspace/llm4binary/github/license_all_cmakelists_25/terablade2001[P]CCEXP/C++/test/../src/include/CCEXP.hpp"
                     ,0x2f);
    if (pcVar2 == (char *)0x0) {
      pcVar2 = strrchr("/workspace/llm4binary/github/license_all_cmakelists_25/terablade2001[P]CCEXP/C++/test/../src/include/CCEXP.hpp"
                       ,0x5c);
      if (pcVar2 == (char *)0x0) {
        local_58 = 
        "/workspace/llm4binary/github/license_all_cmakelists_25/terablade2001[P]CCEXP/C++/test/../src/include/CCEXP.hpp"
        ;
      }
      else {
        local_58 = strrchr("/workspace/llm4binary/github/license_all_cmakelists_25/terablade2001[P]CCEXP/C++/test/../src/include/CCEXP.hpp"
                           ,0x5c);
        local_58 = local_58 + 1;
      }
      local_50 = local_58;
    }
    else {
      local_50 = strrchr("/workspace/llm4binary/github/license_all_cmakelists_25/terablade2001[P]CCEXP/C++/test/../src/include/CCEXP.hpp"
                         ,0x2f);
      local_50 = local_50 + 1;
    }
    CECS::RecError((CECS *)CCEXPECS,-9999,1,local_50,0x350,
                   "[%s]:: getRow():: Failed to find table with name [%s]!",obj->SavingFile,matname)
    ;
    obj_local = (CCEXP *)0x0;
  }
  else {
    obj_local = (CCEXP *)getRow<float>(obj,sel_00,row,cols);
  }
  return (float *)obj_local;
}

Assistant:

inline T* getRow(
	CCEXP &obj, const char* matname, size_t row, size_t &cols
) {
	obj.ErrorId = 0;
	size_t sel = obj.getTableIndexByName(matname);
	CECS_ERRN(CCEXPECS,sel == MAXSIZE_T,"[%s]:: getRow():: Failed to find table with name [%s]!", obj.SavingFile, matname);
	T* vret = getRow<T>(obj, sel, row, cols);
	return vret;
}